

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O2

DWORD __thiscall Memory::HeapInfo::IdleDecommit(HeapInfo *this)

{
  anon_class_8_1_f68bbb60 local_40;
  anon_class_8_1_f68bbb60 local_38;
  DWORD local_2c [2];
  DWORD waitTime;
  
  local_40.waitTime = local_2c;
  local_2c[0] = 0xffffffff;
  local_38.waitTime = local_40.waitTime;
  IdleDecommit::anon_class_8_1_f68bbb60::operator()
            (&local_40,&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommit::anon_class_8_1_f68bbb60::operator()
            (&local_40,&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommit::anon_class_8_1_f68bbb60::operator()
            (&local_40,&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommit::anon_class_8_1_f68bbb60::operator()(&local_38,this->recyclerLeafPageAllocator);
  return local_2c[0];
}

Assistant:

DWORD HeapInfo::IdleDecommit()
{
    DWORD waitTime = INFINITE;
    ForEachPageAllocator([&](IdleDecommitPageAllocator * pageAlloc)
    {
        DWORD pageAllocatorWaitTime = pageAlloc->IdleDecommit();
        waitTime = min(waitTime, pageAllocatorWaitTime);
    });
    return waitTime;
}